

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

OPEN_HANDLE open_create(char *container_id_value)

{
  int iVar1;
  OPEN_INSTANCE_TAG OVar2;
  AMQP_VALUE item_value;
  undefined4 local_24;
  int result;
  AMQP_VALUE container_id_amqp_value;
  OPEN_INSTANCE *open_instance;
  char *container_id_value_local;
  
  container_id_amqp_value = (AMQP_VALUE)malloc(8);
  if (container_id_amqp_value != (AMQP_VALUE)0x0) {
    OVar2.composite_value = amqpvalue_create_composite_with_ulong_descriptor(0x10);
    *(AMQP_VALUE *)container_id_amqp_value = OVar2.composite_value;
    if (*(AMQP_VALUE *)container_id_amqp_value == (AMQP_VALUE)0x0) {
      free(container_id_amqp_value);
      container_id_amqp_value = (AMQP_VALUE)0x0;
    }
    else {
      local_24 = 0;
      item_value = amqpvalue_create_string(container_id_value);
      iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)container_id_amqp_value,0,item_value);
      if (iVar1 != 0) {
        local_24 = 0x2a5;
      }
      amqpvalue_destroy(item_value);
      if (local_24 != 0) {
        open_destroy((OPEN_HANDLE)container_id_amqp_value);
        container_id_amqp_value = (AMQP_VALUE)0x0;
      }
    }
  }
  return (OPEN_HANDLE)container_id_amqp_value;
}

Assistant:

OPEN_HANDLE open_create(const char* container_id_value)
{
    OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)malloc(sizeof(OPEN_INSTANCE));
    if (open_instance != NULL)
    {
        open_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(16);
        if (open_instance->composite_value == NULL)
        {
            free(open_instance);
            open_instance = NULL;
        }
        else
        {
            AMQP_VALUE container_id_amqp_value;
            int result = 0;

            container_id_amqp_value = amqpvalue_create_string(container_id_value);
            if ((result == 0) && (amqpvalue_set_composite_item(open_instance->composite_value, 0, container_id_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(container_id_amqp_value);
            if (result != 0)
            {
                open_destroy(open_instance);
                open_instance = NULL;
            }
        }
    }

    return open_instance;
}